

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zeCommandListUpdateMutableCommandSignalEventExp
          (ze_command_list_handle_t hCommandList,uint64_t commandId,ze_event_handle_t hSignalEvent)

{
  undefined8 local_48;
  ze_pfnCommandListUpdateMutableCommandSignalEventExp_t pfnUpdateMutableCommandSignalEventExp;
  dditable_t *dditable;
  ze_result_t result;
  ze_event_handle_t hSignalEvent_local;
  uint64_t commandId_local;
  ze_command_list_handle_t hCommandList_local;
  
  if (*(code **)(*(long *)(hCommandList + 8) + 0x350) == (code *)0x0) {
    hCommandList_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    if (hSignalEvent == (ze_event_handle_t)0x0) {
      local_48 = 0;
    }
    else {
      local_48 = *(undefined8 *)hSignalEvent;
    }
    hCommandList_local._4_4_ =
         (**(code **)(*(long *)(hCommandList + 8) + 0x350))
                   (*(undefined8 *)hCommandList,commandId,local_48);
  }
  return hCommandList_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListUpdateMutableCommandSignalEventExp(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of the command list
        uint64_t commandId,                             ///< [in] command identifier
        ze_event_handle_t hSignalEvent                  ///< [in][optional] handle of the event to signal on completion
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_command_list_object_t*>( hCommandList )->dditable;
        auto pfnUpdateMutableCommandSignalEventExp = dditable->ze.CommandListExp.pfnUpdateMutableCommandSignalEventExp;
        if( nullptr == pfnUpdateMutableCommandSignalEventExp )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hCommandList = reinterpret_cast<ze_command_list_object_t*>( hCommandList )->handle;

        // convert loader handle to driver handle
        hSignalEvent = ( hSignalEvent ) ? reinterpret_cast<ze_event_object_t*>( hSignalEvent )->handle : nullptr;

        // forward to device-driver
        result = pfnUpdateMutableCommandSignalEventExp( hCommandList, commandId, hSignalEvent );

        return result;
    }